

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

char * FT_Get_Postscript_Name(FT_Face face)

{
  FT_Module_Requester p_Var1;
  undefined8 *puVar2;
  char *pcVar3;
  FT_Face_Internal pFVar4;
  undefined8 *puVar5;
  
  if (face != (FT_Face)0x0) {
    pFVar4 = face->internal;
    puVar2 = (undefined8 *)(pFVar4->services).service_POSTSCRIPT_FONT_NAME;
    if (puVar2 != (undefined8 *)0xfffffffffffffffe) {
      if (puVar2 == (undefined8 *)0x0) {
        p_Var1 = ((face->driver->root).clazz)->get_interface;
        if (p_Var1 == (FT_Module_Requester)0x0) {
          puVar2 = (undefined8 *)0x0;
        }
        else {
          puVar2 = (undefined8 *)(*p_Var1)(&face->driver->root,"postscript-font-name");
          pFVar4 = face->internal;
        }
        puVar5 = (undefined8 *)0xfffffffffffffffe;
        if (puVar2 != (undefined8 *)0x0) {
          puVar5 = puVar2;
        }
        (pFVar4->services).service_POSTSCRIPT_FONT_NAME = puVar5;
      }
      if ((puVar2 != (undefined8 *)0x0) && ((code *)*puVar2 != (code *)0x0)) {
        pcVar3 = (char *)(*(code *)*puVar2)(face);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

FT_EXPORT_DEF( const char* )
  FT_Get_Postscript_Name( FT_Face  face )
  {
    const char*  result = NULL;


    if ( !face )
      goto Exit;

    if ( !result )
    {
      FT_Service_PsFontName  service;


      FT_FACE_LOOKUP_SERVICE( face,
                              service,
                              POSTSCRIPT_FONT_NAME );

      if ( service && service->get_ps_font_name )
        result = service->get_ps_font_name( face );
    }

  Exit:
    return result;
  }